

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O2

int ncnn::binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  uint uVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  ulong uVar14;
  int iVar15;
  long lVar16;
  undefined1 (*pauVar17) [16];
  int iVar18;
  undefined1 (*pauVar19) [32];
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar25 [64];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar22 [32];
  
  uVar4 = b->c;
  iVar15 = b->h * b->w * b->d * b->elempack;
  Mat::create_like(c,b,opt->blob_allocator);
  iVar18 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    uVar20 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar20 = 0;
    }
    for (uVar14 = 0; uVar14 != uVar20; uVar14 = uVar14 + 1) {
      fVar1 = *a->data;
      auVar21._4_4_ = fVar1;
      auVar21._0_4_ = fVar1;
      auVar21._8_4_ = fVar1;
      auVar21._12_4_ = fVar1;
      auVar22._16_4_ = fVar1;
      auVar22._0_16_ = auVar21;
      auVar22._20_4_ = fVar1;
      auVar22._24_4_ = fVar1;
      auVar22._28_4_ = fVar1;
      pvVar5 = b->data;
      sVar6 = b->elemsize;
      sVar7 = b->cstep;
      pauVar19 = (undefined1 (*) [32])(sVar7 * uVar14 * sVar6 + (long)pvVar5);
      pvVar8 = c->data;
      sVar9 = c->elemsize;
      sVar10 = c->cstep;
      pauVar17 = (undefined1 (*) [16])(sVar10 * uVar14 * sVar9 + (long)pvVar8);
      lVar16 = 0;
      for (iVar18 = 0; iVar18 + 7 < iVar15; iVar18 = iVar18 + 8) {
        auVar3 = *pauVar19;
        auVar12 = vrcpps_avx(auVar3);
        auVar25._0_4_ = fVar1 * auVar12._0_4_;
        auVar25._4_4_ = fVar1 * auVar12._4_4_;
        auVar25._8_4_ = fVar1 * auVar12._8_4_;
        auVar25._12_4_ = fVar1 * auVar12._12_4_;
        auVar25._16_4_ = fVar1 * auVar12._16_4_;
        auVar25._20_4_ = fVar1 * auVar12._20_4_;
        auVar25._28_36_ = in_ZMM3._28_36_;
        auVar25._24_4_ = fVar1 * auVar12._24_4_;
        auVar13._4_4_ = auVar3._4_4_ * auVar25._4_4_;
        auVar13._0_4_ = auVar3._0_4_ * auVar25._0_4_;
        auVar13._8_4_ = auVar3._8_4_ * auVar25._8_4_;
        auVar13._12_4_ = auVar3._12_4_ * auVar25._12_4_;
        auVar13._16_4_ = auVar3._16_4_ * auVar25._16_4_;
        auVar13._20_4_ = auVar3._20_4_ * auVar25._20_4_;
        auVar13._24_4_ = auVar3._24_4_ * auVar25._24_4_;
        auVar13._28_4_ = auVar3._28_4_;
        auVar3 = vsubps_avx(auVar22,auVar13);
        *(float *)*pauVar17 = auVar25._0_4_ + auVar12._0_4_ * auVar3._0_4_;
        *(float *)((long)*pauVar17 + 4) = auVar25._4_4_ + auVar12._4_4_ * auVar3._4_4_;
        *(float *)((long)*pauVar17 + 8) = auVar25._8_4_ + auVar12._8_4_ * auVar3._8_4_;
        *(float *)((long)*pauVar17 + 0xc) = auVar25._12_4_ + auVar12._12_4_ * auVar3._12_4_;
        *(float *)pauVar17[1] = auVar25._16_4_ + auVar12._16_4_ * auVar3._16_4_;
        *(float *)(pauVar17[1] + 4) = auVar25._20_4_ + auVar12._20_4_ * auVar3._20_4_;
        *(float *)(pauVar17[1] + 8) = auVar25._24_4_ + auVar12._24_4_ * auVar3._24_4_;
        *(float *)(pauVar17[1] + 0xc) = in_ZMM3._28_4_ + auVar3._28_4_;
        pauVar19 = pauVar19 + 1;
        pauVar17 = pauVar17 + 2;
        lVar16 = lVar16 + 8;
        in_ZMM3 = ZEXT3264(auVar25._0_32_);
      }
      auVar21 = vshufps_avx(auVar21,auVar21,0);
      for (; iVar18 + 3 < iVar15; iVar18 = iVar18 + 4) {
        auVar2 = *(undefined1 (*) [16])*pauVar19;
        auVar11 = vrcpps_avx(auVar2);
        in_ZMM3 = ZEXT1664(auVar11);
        fVar26 = auVar21._0_4_ * auVar11._0_4_;
        fVar27 = auVar21._4_4_ * auVar11._4_4_;
        fVar28 = auVar21._8_4_ * auVar11._8_4_;
        fVar29 = auVar21._12_4_ * auVar11._12_4_;
        auVar23._0_4_ = auVar2._0_4_ * fVar26;
        auVar23._4_4_ = auVar2._4_4_ * fVar27;
        auVar23._8_4_ = auVar2._8_4_ * fVar28;
        auVar23._12_4_ = auVar2._12_4_ * fVar29;
        auVar2 = vsubps_avx(auVar21,auVar23);
        auVar24._0_4_ = fVar26 + auVar11._0_4_ * auVar2._0_4_;
        auVar24._4_4_ = fVar27 + auVar11._4_4_ * auVar2._4_4_;
        auVar24._8_4_ = fVar28 + auVar11._8_4_ * auVar2._8_4_;
        auVar24._12_4_ = fVar29 + auVar11._12_4_ * auVar2._12_4_;
        *pauVar17 = auVar24;
        pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
        pauVar17 = pauVar17 + 1;
        lVar16 = lVar16 + 4;
      }
      for (; (int)lVar16 < iVar15; lVar16 = lVar16 + 1) {
        *(float *)((long)pvVar8 + lVar16 * 4 + sVar10 * sVar9 * uVar14) =
             fVar1 / *(float *)((long)pvVar5 + lVar16 * 4 + sVar7 * sVar6 * uVar14);
      }
    }
    iVar18 = 0;
  }
  return iVar18;
}

Assistant:

static int binary_op_2_3_4_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = b.w;
    int h = b.h;
    int d = b.d;
    int channels = b.c;
    int elempack = b.elempack;
    int size = w * h * d * elempack;

    // type 2 3 4 20
    c.create_like(b, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float a0 = a[0];
        const float* ptr = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _a0_avx512 = _mm512_set1_ps(a0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_a0_avx512, _p);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _a0_avx = _mm256_set1_ps(a0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_a0_avx, _p);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _a0 = _mm_set1_ps(a0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_a0, _p);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(a0, *ptr);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}